

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

string * r8_to_string(string *__return_storage_ptr__,double r8,string *format)

{
  char *__format;
  allocator<char> local_a1;
  string local_a0 [39];
  undefined1 local_79;
  char local_78 [8];
  char r8_char [80];
  string *format_local;
  double r8_local;
  string *r8_string;
  
  local_79 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __format = (char *)std::__cxx11::string::c_str();
  sprintf(local_78,__format,r8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,local_78,&local_a1);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  return __return_storage_ptr__;
}

Assistant:

std::string r8_to_string ( double r8, std::string format )

//****************************************************************************80
//
//  Purpose:
//
//    R8_TO_STRING converts an R8 to a C++ string.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    09 July 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double R8, a double.
//
//    Input, string FORMAT, the format string.
//
//    Output, string R8_TO_STRING, the string.
//
{
  char r8_char[80];
  std::string r8_string;

  sprintf ( r8_char, format.c_str ( ), r8 );

  r8_string = std::string ( r8_char );

  return r8_string;
}